

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_add_mips(float16 a,float16 b,float_status *status)

{
  FloatParts b_00;
  FloatParts a_00;
  _Bool _Var1;
  float16 fVar2;
  int iVar3;
  bool bVar4;
  FloatParts FVar5;
  FloatParts FVar6;
  FloatParts pr;
  FloatParts pb;
  FloatParts pa;
  float_status *status_local;
  float16 b_local;
  float16 a_local;
  uint64_t local_98;
  ulong local_78;
  bool local_61;
  int shift;
  _Bool b_sign;
  _Bool a_sign;
  uint64_t local_50;
  int local_48;
  FloatClass FStack_44;
  _Bool _Stack_43;
  undefined2 uStack_42;
  ulong local_40;
  int local_38;
  FloatClass FStack_34;
  _Bool _Stack_33;
  undefined2 uStack_32;
  FloatParts local_30;
  float_status *local_20;
  uint64_t local_18;
  undefined8 local_10;
  
  FVar5 = float16a_unpack_canonical(a,status,&float16_params);
  local_78 = FVar5.frac;
  FVar6 = float16a_unpack_canonical(b,status,&float16_params);
  local_98 = FVar6.frac;
  local_40 = local_78;
  local_38 = FVar5.exp;
  FStack_34 = FVar5.cls;
  _Stack_33 = FVar5.sign;
  uStack_32 = FVar5._14_2_;
  local_50 = local_98;
  local_48 = FVar6.exp;
  FStack_44 = FVar6.cls;
  _Stack_43 = FVar6.sign;
  uStack_42 = FVar6._14_2_;
  local_61 = (bool)(_Stack_33 & 1);
  bVar4 = ((undefined1  [16])FVar6 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0;
  if (local_61 == bVar4) {
    if ((FStack_34 == float_class_normal) && (FStack_44 == float_class_normal)) {
      if (local_48 < local_38) {
        shift64RightJamming(local_98,local_38 - local_48,&local_50);
      }
      else if (local_38 < local_48) {
        shift64RightJamming(local_78,local_48 - local_38,&local_40);
        local_38 = local_48;
      }
      local_40 = local_50 + local_40;
      if ((local_40 & 0x8000000000000000) != 0) {
        shift64RightJamming(local_40,1,&local_40);
        local_38 = local_38 + 1;
      }
      local_30.cls = FStack_34;
      local_30.exp = local_38;
      local_30.sign = _Stack_33;
      local_30._14_2_ = uStack_32;
      local_30.frac = local_40;
    }
    else {
      _Var1 = is_nan(FStack_34);
      if ((_Var1) || (_Var1 = is_nan(FStack_44), _Var1)) {
        FVar6.exp = local_38;
        FVar6.frac = local_40;
        FVar6.cls = FStack_34;
        FVar6.sign = _Stack_33;
        FVar6._14_2_ = uStack_32;
        FVar5.exp = local_48;
        FVar5.frac = local_50;
        FVar5.cls = FStack_44;
        FVar5.sign = _Stack_43;
        FVar5._14_2_ = uStack_42;
        local_30 = pick_nan(FVar6,FVar5,status);
      }
      else if ((FStack_34 == float_class_inf) || (FStack_44 == float_class_zero)) {
        local_30.cls = FStack_34;
        local_30.exp = local_38;
        local_30.sign = _Stack_33;
        local_30._14_2_ = uStack_32;
        local_30.frac = local_40;
      }
      else {
        if ((FStack_44 != float_class_inf) && (FStack_34 != float_class_zero)) {
LAB_008f90ea:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
        local_30.cls = FStack_44;
        local_30.exp = local_48;
        local_30.sign = bVar4;
        local_30._14_2_ = uStack_42;
        local_30.frac = local_50;
        _Stack_43 = bVar4;
      }
    }
  }
  else if ((FStack_34 == float_class_normal) && (FStack_44 == float_class_normal)) {
    if ((local_48 < local_38) || ((local_38 == local_48 && (local_98 <= local_78)))) {
      shift64RightJamming(local_98,local_38 - local_48,&local_50);
      local_40 = local_40 - local_50;
    }
    else {
      shift64RightJamming(local_78,local_48 - local_38,&local_40);
      local_40 = local_50 - local_40;
      local_38 = local_48;
      local_61 = local_61 != true;
    }
    if (local_40 == 0) {
      FStack_34 = float_class_zero;
      _Stack_33 = status->float_rounding_mode == '\x01';
    }
    else {
      iVar3 = clz64(local_40);
      local_40 = local_40 << ((byte)(iVar3 + -1) & 0x3f);
      local_38 = local_38 - (iVar3 + -1);
      _Stack_33 = local_61;
    }
    local_30.cls = FStack_34;
    local_30.exp = local_38;
    local_30.sign = _Stack_33;
    local_30._14_2_ = uStack_32;
    local_30.frac = local_40;
  }
  else {
    _Var1 = is_nan(FStack_34);
    if ((_Var1) || (_Var1 = is_nan(FStack_44), _Var1)) {
      a_00.exp = local_38;
      a_00.frac = local_40;
      a_00.cls = FStack_34;
      a_00.sign = _Stack_33;
      a_00._14_2_ = uStack_32;
      b_00.exp = local_48;
      b_00.frac = local_50;
      b_00.cls = FStack_44;
      b_00.sign = _Stack_43;
      b_00._14_2_ = uStack_42;
      local_30 = pick_nan(a_00,b_00,status);
    }
    else if (FStack_34 == float_class_inf) {
      if (FStack_44 == float_class_inf) {
        float_raise_mips('\x01',status);
        local_30 = parts_default_nan(status);
      }
      else {
        local_30.cls = 3;
        local_30.exp = local_38;
        local_30.sign = _Stack_33;
        local_30._14_2_ = uStack_32;
        local_30.frac = local_40;
      }
    }
    else if ((FStack_34 == float_class_zero) && (FStack_44 == float_class_zero)) {
      _Stack_33 = status->float_rounding_mode == '\x01';
      local_30.cls = 1;
      local_30.exp = local_38;
      local_30.sign = _Stack_33;
      local_30._14_2_ = uStack_32;
      local_30.frac = local_40;
    }
    else if ((FStack_34 == float_class_zero) || (FStack_44 == float_class_inf)) {
      local_30.cls = FStack_44;
      local_30.exp = local_48;
      local_30.sign = local_61 != true;
      local_30._14_2_ = uStack_42;
      local_30.frac = local_50;
      _Stack_43 = local_61 != true;
    }
    else {
      if (FStack_44 != float_class_zero) goto LAB_008f90ea;
      local_30.cls = FStack_34;
      local_30.exp = local_38;
      local_30.sign = _Stack_33;
      local_30._14_2_ = uStack_32;
      local_30.frac = local_40;
    }
  }
  FVar5 = local_30;
  local_18 = local_30.frac;
  local_10._0_4_ = local_30.exp;
  local_10._4_1_ = local_30.cls;
  local_10._5_1_ = local_30.sign;
  local_10._6_2_ = local_30._14_2_;
  local_30 = FVar5;
  local_20 = status;
  fVar2 = float16a_round_pack_canonical(FVar5,status,&float16_params);
  return fVar2;
}

Assistant:

float16 QEMU_FLATTEN float16_add(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, false, status);

    return float16_round_pack_canonical(pr, status);
}